

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_writer_reader_phaser.c
# Opt level: O0

void hdr_phaser_flip_phase(hdr_writer_reader_phaser *p,int64_t sleep_time_ns)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t *local_60;
  uint local_54;
  int64_t *end_epoch;
  int64_t initial_start_value;
  _Bool next_phase_is_even;
  int64_t start_epoch;
  uint sleep_time_us;
  int64_t start_value_at_flip;
  _Bool caught_up;
  int64_t sleep_time_ns_local;
  hdr_writer_reader_phaser *p_local;
  
  if (sleep_time_ns < 1000000000) {
    local_54 = (uint)(sleep_time_ns / 1000);
  }
  else {
    local_54 = 1000000;
  }
  iVar1 = _hdr_phaser_get_epoch(&p->start_epoch);
  if (-1 < iVar1) {
    end_epoch = (int64_t *)0x8000000000000000;
    _hdr_phaser_set_epoch(&p->odd_end_epoch,-0x8000000000000000);
  }
  else {
    end_epoch = (int64_t *)0x0;
    _hdr_phaser_set_epoch(&p->even_end_epoch,0);
  }
  iVar2 = _hdr_phaser_reset_epoch(&p->start_epoch,(int64_t)end_epoch);
  do {
    if (-1 < iVar1) {
      local_60 = &p->even_end_epoch;
    }
    else {
      local_60 = &p->odd_end_epoch;
    }
    iVar3 = _hdr_phaser_get_epoch(local_60);
    if (iVar3 != iVar2) {
      if (local_54 == 0) {
        hdr_yield();
      }
      else {
        hdr_usleep(local_54);
      }
    }
  } while (iVar3 != iVar2);
  return;
}

Assistant:

void hdr_phaser_flip_phase(
    struct hdr_writer_reader_phaser* p, int64_t sleep_time_ns)
{
    bool caught_up;
    int64_t start_value_at_flip;
    /* TODO: is_held_by_current_thread */
    unsigned int sleep_time_us = sleep_time_ns < 1000000000 ? (unsigned int) (sleep_time_ns / 1000) : 1000000;

    int64_t start_epoch = _hdr_phaser_get_epoch(&p->start_epoch);

    bool next_phase_is_even = (start_epoch < 0);

    /* Clear currently used phase end epoch.*/
    int64_t initial_start_value;
    if (next_phase_is_even)
    {
        initial_start_value = 0;
        _hdr_phaser_set_epoch(&p->even_end_epoch, initial_start_value);
    }
    else
    {
        initial_start_value = INT64_MIN;
        _hdr_phaser_set_epoch(&p->odd_end_epoch, initial_start_value);
    }

    /* Reset start value, indicating new phase.*/
    start_value_at_flip = _hdr_phaser_reset_epoch(&p->start_epoch, initial_start_value);

    do
    {
        int64_t* end_epoch =
            next_phase_is_even ? &p->odd_end_epoch : &p->even_end_epoch;

        caught_up = _hdr_phaser_get_epoch(end_epoch) == start_value_at_flip;

        if (!caught_up)
        {
            if (sleep_time_us <= 0)
            {
                hdr_yield();
            }
            else
            {
                hdr_usleep(sleep_time_us);
            }
        }
    }
    while (!caught_up);
}